

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_routing_generic_rt_to_string.c
# Opt level: O1

char * os_routing_generic_rt_to_string(os_route_str *buf,os_route_parameter *route_parameter)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  os_route_str *poVar10;
  char ifbuf [16];
  netaddr_str buf4;
  netaddr_str buf3;
  netaddr_str buf2;
  netaddr_str buf1;
  
  pcVar5 = netaddr_to_prefixstring(&buf1,&route_parameter->src_ip,false);
  pcVar6 = netaddr_to_prefixstring(&buf2,&route_parameter->gw,false);
  pcVar3 = _route_types[route_parameter->type];
  pcVar7 = netaddr_to_prefixstring(&buf3,&(route_parameter->key).dst,false);
  pcVar8 = netaddr_to_prefixstring(&buf4,&(route_parameter->key).src,false);
  bVar1 = route_parameter->table;
  bVar2 = route_parameter->protocol;
  uVar4 = route_parameter->metric;
  pcVar9 = if_indextoname(route_parameter->if_index,ifbuf);
  uVar4 = snprintf(buf->buf,0x162,
                   "\'src-ip %s gw %s dst %s %s src-prefix %s metric %d table %u protocol %u if %s (%u)\'"
                   ,pcVar5,pcVar6,pcVar3,pcVar7,pcVar8,(ulong)uVar4,(ulong)bVar1,(ulong)bVar2,pcVar9
                   ,(ulong)route_parameter->if_index);
  poVar10 = (os_route_str *)0x0;
  if (uVar4 < 0x163) {
    poVar10 = buf;
  }
  return poVar10->buf;
}

Assistant:

const char *
os_routing_generic_rt_to_string(struct os_route_str *buf, const struct os_route_parameter *route_parameter) {
  struct netaddr_str buf1, buf2, buf3, buf4;
  char ifbuf[IF_NAMESIZE];
  int result;
  result = snprintf(buf->buf, sizeof(*buf),
    "'src-ip %s gw %s dst %s %s src-prefix %s metric %d table %u protocol %u if %s (%u)'",
    netaddr_to_string(&buf1, &route_parameter->src_ip), netaddr_to_string(&buf2, &route_parameter->gw),
    _route_types[route_parameter->type], netaddr_to_string(&buf3, &route_parameter->key.dst),
    netaddr_to_string(&buf4, &route_parameter->key.src), route_parameter->metric,
    (unsigned int)(route_parameter->table), (unsigned int)(route_parameter->protocol),
    if_indextoname(route_parameter->if_index, ifbuf), route_parameter->if_index);

  if (result < 0 || result > (int)sizeof(*buf)) {
    return NULL;
  }
  return buf->buf;
}